

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O1

void dtl_sv_create(dtl_sv_t *self)

{
  dtl_svx_t *pdVar1;
  
  if (self != (dtl_sv_t *)0x0) {
    pdVar1 = (dtl_svx_t *)malloc(0x18);
    self->pAny = pdVar1;
    if (pdVar1 == (dtl_svx_t *)0x0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/dtl_type/src/dtl_sv.c"
                    ,0x6d,"void dtl_sv_create(dtl_sv_t *)");
    }
    pdVar1->tmpStr = (adt_str_t *)0x0;
    (pdVar1->val).i64 = 0;
    (pdVar1->val).ptr.pDestructor = (apx_void_ptr_func_t *)0x0;
    self->u32RefCnt = 1;
    self->u32Flags = 2;
    pdVar1->tmpStr = (adt_str_t *)0x0;
  }
  return;
}

Assistant:

void dtl_sv_create(dtl_sv_t* self)
{
   if(self)
   {
      self->pAny = (dtl_svx_t*) malloc(sizeof(dtl_svx_t));
      if (self->pAny != 0)
      {
         memset(self->pAny, 0, sizeof(dtl_svx_t));
         self->u32Flags = ((uint32_t)DTL_DV_SCALAR);
         self->u32RefCnt = 1;
         self->pAny->tmpStr = (adt_str_t*) 0;
      }
      else
      {
         assert(0);
      }
   }
}